

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

int ReadVarInt<SpanReader,(VarIntMode)1,int>(SpanReader *is)

{
  char *pcVar1;
  size_t in_RCX;
  uint unaff_EBP;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  uint8_t obj;
  uint local_38 [2];
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  do {
    SpanReader::read(is,(int)local_38,(void *)0x1,in_RCX);
    if (0xffffff < (int)uVar3) {
      pcVar1 = (char *)__cxa_allocate_exception(0x20);
      local_30 = std::iostream_category();
      local_38[0] = 1;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar1,(error_code *)"ReadVarInt(): size too large");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_00324499;
    }
    in_RCX = (size_t)(uVar3 << 7);
    uVar3 = local_38[0] & 0x7f | uVar3 << 7;
    uVar2 = uVar3;
    if ((char)local_38[0] < '\0') {
      if (uVar3 == 0x7fffffff) {
        pcVar1 = (char *)__cxa_allocate_exception(0x20);
        local_30 = std::iostream_category();
        local_38[0] = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar1,(error_code *)"ReadVarInt(): size too large");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_00324499;
      }
      uVar3 = uVar3 + 1;
      uVar2 = unaff_EBP;
    }
    unaff_EBP = uVar2;
  } while ((char)local_38[0] < '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar2;
  }
LAB_00324499:
  __stack_chk_fail();
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}